

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

void serialization::serialize<serialization::json_oarchive,AddressBook>
               (json_oarchive *ar,AddressBook *v)

{
  char *pcVar1;
  char **local_20;
  
  pcVar1 = (ar->writer_).level_stack_.stack_;
  (ar->buffer_).stack_.stackTop_ = (ar->buffer_).stack_.stack_;
  (ar->writer_).os_ = &ar->buffer_;
  (ar->writer_).hasRoot_ = false;
  (ar->writer_).level_stack_.stackTop_ = pcVar1;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&ar->writer_);
  local_20 = &AddressBook::serialization_meta()::meta;
  serialize_unpack<char_const*const*,serialization::json_oarchive,std::vector<Person,std::allocator<Person>>const&,std::optional<std::__cxx11::string>const&,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>const&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
            (&local_20,ar,&v->people,&v->opt,&v->mapTest,&v->vectorTest);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&ar->writer_,0);
  return;
}

Assistant:

void serialize(Archive & ar, const Value & v)
{
    ar.serialize_start();
    serialization::serialize_helper(ar, v);
    ar.serialize_end();
}